

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

_Bool al_rebase_path(ALLEGRO_PATH *head,ALLEGRO_PATH *tail)

{
  _Bool _Var1;
  char *pcVar2;
  uint i;
  ulong uVar3;
  
  _Var1 = path_is_absolute(tail);
  if (!_Var1) {
    pcVar2 = al_get_path_drive(head);
    al_set_path_drive(tail,pcVar2);
    uVar3 = 0;
    while (i = (uint)uVar3, uVar3 < (head->segments)._size) {
      pcVar2 = get_segment_cstr(head,i);
      al_insert_path_component(tail,i,pcVar2);
      uVar3 = (ulong)(i + 1);
    }
  }
  return !_Var1;
}

Assistant:

bool al_rebase_path(const ALLEGRO_PATH *head, ALLEGRO_PATH *tail)
{
   unsigned i;
   ASSERT(head);
   ASSERT(tail);

   /* Don't bother concating if the tail is an absolute path. */
   if (path_is_absolute(tail)) {
      return false;
   }

   al_set_path_drive(tail, al_get_path_drive(head));

   for (i = 0; i < _al_vector_size(&head->segments); i++) {
      al_insert_path_component(tail, i, get_segment_cstr(head, i));
   }

   return true;
}